

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O3

reference __thiscall
pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>::chunk::
emplace_back<pstore::index::details::index_pointer_const&,unsigned_long_const&>
          (chunk *this,index_pointer *args,unsigned_long *args_1)

{
  internal_node *this_00;
  
  if (*(ulong *)this < 0x2aaa) {
    this_00 = chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk::
              operator[]((chunk *)this,*(ulong *)this);
    index::details::internal_node::internal_node(this_00,args,*args_1);
    *(long *)this = *(long *)this + 1;
    return this_00;
  }
  assert_failed("size_ < membs_.size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                ,0x1db);
}

Assistant:

auto chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::chunk::emplace_back (
        Args &&... args) -> reference {
        PSTORE_ASSERT (size_ < membs_.size ());
        T & place = (*this)[size_];
        new (&place) T (std::forward<Args> (args)...);
        ++size_;
        return place;
    }